

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O3

int __thiscall CTPNCodeBodyBase::get_ctx_var_for_level(CTPNCodeBodyBase *this,int level,int *varnum)

{
  uint uVar1;
  CTcCodeBodyCtx *pCVar2;
  
  if (level == 0) {
    *varnum = this->local_ctx_var_;
    uVar1 = *(uint *)&this->field_0xb8 >> 3 & 1;
  }
  else {
    uVar1 = 0;
    for (pCVar2 = this->ctx_head_; pCVar2 != (CTcCodeBodyCtx *)0x0; pCVar2 = pCVar2->nxt_) {
      if (pCVar2->level_ == level) {
        *varnum = pCVar2->var_num_;
        return 1;
      }
    }
  }
  return uVar1;
}

Assistant:

int CTPNCodeBodyBase::get_ctx_var_for_level(int level, int *varnum)
{
    /* if they want level zero, it's our local context */
    if (level == 0)
    {
        /* set the variable ID to our local context variable */
        *varnum = local_ctx_var_;

        /* return true only if we actually have a local context */
        return has_local_ctx_;
    }

    /* scan our list to see if the level is already assigned */
    for (CTcCodeBodyCtx *ctx = ctx_head_ ; ctx != 0 ; ctx = ctx->nxt_)
    {
        /* if we've already set up this level, return its variable */
        if (ctx->level_ == level)
        {
            /* set the caller's variable number */
            *varnum = ctx->var_num_;

            /* indicate that we found it */
            return TRUE;
        }
    }

    /* didn't find it */
    return FALSE;
}